

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeWebAssemblyModuleConstructor
               (DynamicObject *constructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  undefined8 in_RAX;
  uint uVar3;
  StaticType *type;
  LiteralString *pLVar1;
  RuntimeFunction *pRVar2;
  ulong uVar4;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,constructor,mode,5,0);
  this = (((constructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  uVar4 = (ulong)uVar3 << 0x20;
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(constructor,0xd1,&DAT_1000000000001,2,0,0,uVar4);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (constructor,0x124,(this->webAssemblyModulePrototype).ptr,0,0,0,uVar4);
  type = StringCache::GetStringTypeStatic(&this->stringCache);
  pLVar1 = LiteralString::New(type,L"Module",6,this->recycler);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(constructor,0x106,pLVar1,2,0,0,uVar4);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssemblyModule::EntryInfo::Exports,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xe8);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(constructor,0xe8,pRVar2,6,0,0,uVar4);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssemblyModule::EntryInfo::Imports,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xe9);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(constructor,0xe9,pRVar2,6,0,0,uVar4);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssemblyModule::EntryInfo::CustomSections,2,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xea);
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(constructor,0xea,pRVar2,6,0,0,uVar4 & 0xffffffff00000000);
  DynamicObject::SetHasNoEnumerableProperties(constructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyModuleConstructor(DynamicObject* constructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(constructor, mode, 5);
        JavascriptLibrary* library = constructor->GetLibrary();

        library->AddMember(constructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(constructor, PropertyIds::prototype, library->webAssemblyModulePrototype, PropertyNone);
        library->AddMember(constructor, PropertyIds::name, library->CreateStringFromCppLiteral(_u("Module")), PropertyConfigurable);

        library->AddFunctionToLibraryObject(constructor, PropertyIds::exports, &WebAssemblyModule::EntryInfo::Exports, 1);
        library->AddFunctionToLibraryObject(constructor, PropertyIds::imports, &WebAssemblyModule::EntryInfo::Imports, 1);
        library->AddFunctionToLibraryObject(constructor, PropertyIds::customSections, &WebAssemblyModule::EntryInfo::CustomSections, 2);

        constructor->SetHasNoEnumerableProperties(true);

        return true;
    }